

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::Boxed_Number::oper(Boxed_Number *this,Opers t_oper,Boxed_Value *t_lhs)

{
  Boxed_Value BVar1;
  undefined1 local_30 [8];
  anon_class_16_2_73f5579e unary_operator;
  Boxed_Value *t_lhs_local;
  Opers t_oper_local;
  
  local_30._0_4_ = t_oper;
  unary_operator._0_8_ = t_lhs;
  unary_operator.t_lhs = t_lhs;
  BVar1 = visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
                    (this,t_lhs,(anon_class_16_2_73f5579e *)local_30);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline static Boxed_Value oper(Operators::Opers t_oper, const Boxed_Value &t_lhs) {
      auto unary_operator = [t_oper, &t_lhs](const auto &c_lhs) {
        auto *lhs = static_cast<std::decay_t<decltype(c_lhs)> *>(t_lhs.get_ptr());

        if (lhs) {
          switch (t_oper) {
            case Operators::Opers::pre_increment:
              ++(*lhs);
              return t_lhs;
            case Operators::Opers::pre_decrement:
              --(*lhs);
              return t_lhs;
            default:
              break;
          }
        }

        switch (t_oper) {
          case Operators::Opers::unary_minus:
            return const_var(-c_lhs);
          case Operators::Opers::unary_plus:
            return const_var(+c_lhs);
          default:
            break;
        }

        if constexpr (!std::is_floating_point_v<std::decay_t<decltype(c_lhs)>>) {
          switch (t_oper) {
            case Operators::Opers::bitwise_complement:
              return const_var(~c_lhs);
            default:
              break;
          }
        }

        throw chaiscript::detail::exception::bad_any_cast();
      };

      return visit(t_lhs, unary_operator);
    }